

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

int Eval::getResult(BitBoard *my,int empties)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = *my - (*my >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  bVar1 = (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  iVar2 = empties + (uint)bVar1 * 2;
  iVar5 = (bVar1 - 0x40) + (uint)bVar1;
  if (iVar2 == 0x40) {
    iVar5 = 0;
  }
  iVar3 = empties + -0x40 + iVar2;
  if (iVar2 < 0x41) {
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

inline int Eval::bits(const BitBoard& bb) {
    const unsigned long long c55 = 0x5555555555555555ull;
	const unsigned long long c33 = 0x3333333333333333ull;
	const unsigned long long c0f = 0x0f0f0f0f0f0f0f0full;
	const unsigned long long h01 = 0x0101010101010101ull;
	BitBoard x = bb;
	x -= (x >> 1) & c55;
	x = (x & c33) + ((x >> 2) & c33);
	x = (x + (x >> 4)) & c0f;
	return (x * h01) >> 56;
}